

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O2

wchar_t vorbis_finish_frame(stb_vorbis *f,wchar_t len,wchar_t left,wchar_t right)

{
  wchar_t wVar1;
  wchar_t wVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  
  wVar1 = f->previous_length;
  if (wVar1 == L'\0') {
    bVar7 = true;
  }
  else {
    lVar3 = 0x5b8;
    if ((wVar1 * 2 != f->blocksize_0) && (lVar3 = 0x5c0, wVar1 * 2 != f->blocksize_1)) {
      return L'\0';
    }
    lVar3 = *(long *)((long)&f->sample_rate + lVar3);
    if (lVar3 == 0) {
      return L'\0';
    }
    lVar4 = 0;
    uVar5 = 0;
    if (L'\0' < wVar1) {
      uVar5 = (ulong)(uint)wVar1;
    }
    for (; lVar4 < f->channels; lVar4 = lVar4 + 1) {
      wVar2 = wVar1;
      for (uVar6 = 0; wVar2 = wVar2 + L'\xffffffff', uVar5 != uVar6; uVar6 = uVar6 + 1) {
        f->channel_buffers[lVar4][(long)left + uVar6] =
             f->channel_buffers[lVar4][(long)left + uVar6] * *(float *)(lVar3 + uVar6 * 4) +
             f->previous_window[lVar4][uVar6] * *(float *)(lVar3 + (long)wVar2 * 4);
      }
    }
    bVar7 = f->previous_length == L'\0';
  }
  f->previous_length = len - right;
  for (lVar3 = 0; lVar3 < f->channels; lVar3 = lVar3 + 1) {
    for (lVar4 = 0; right + lVar4 < (long)len; lVar4 = lVar4 + 1) {
      f->previous_window[lVar3][lVar4] = f->channel_buffers[lVar3][right + lVar4];
    }
  }
  if (bVar7) {
    return L'\0';
  }
  if (len < right) {
    right = len;
  }
  f->samples_output = f->samples_output + (right - left);
  return right - left;
}

Assistant:

static int vorbis_finish_frame(stb_vorbis *f, int len, int left, int right)
{
   int prev,i,j;
   // we use right&left (the start of the right- and left-window sin()-regions)
   // to determine how much to return, rather than inferring from the rules
   // (same result, clearer code); 'left' indicates where our sin() window
   // starts, therefore where the previous window's right edge starts, and
   // therefore where to start mixing from the previous buffer. 'right'
   // indicates where our sin() ending-window starts, therefore that's where
   // we start saving, and where our returned-data ends.

   // mixin from previous window
   if (f->previous_length) {
      int i,j, n = f->previous_length;
      float *w = get_window(f, n);
      if (w == NULL) return 0;
      for (i=0; i < f->channels; ++i) {
         for (j=0; j < n; ++j)
            f->channel_buffers[i][left+j] =
               f->channel_buffers[i][left+j]*w[    j] +
               f->previous_window[i][     j]*w[n-1-j];
      }
   }

   prev = f->previous_length;

   // last half of this data becomes previous window
   f->previous_length = len - right;

   // @OPTIMIZE: could avoid this copy by double-buffering the
   // output (flipping previous_window with channel_buffers), but
   // then previous_window would have to be 2x as large, and
   // channel_buffers couldn't be temp mem (although they're NOT
   // currently temp mem, they could be (unless we want to level
   // performance by spreading out the computation))
   for (i=0; i < f->channels; ++i)
      for (j=0; right+j < len; ++j)
         f->previous_window[i][j] = f->channel_buffers[i][right+j];

   if (!prev)
      // there was no previous packet, so this data isn't valid...
      // this isn't entirely true, only the would-have-overlapped data
      // isn't valid, but this seems to be what the spec requires
      return 0;

   // truncate a short frame
   if (len < right) right = len;

   f->samples_output += right-left;

   return right - left;
}